

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test44(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x4ff,"void test44(const char *, const char *, const char *, const char *)");
  }
  iVar1 = qpdf_update_from_json_file(qpdf,xarg);
  if (iVar1 == 0) {
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    return;
  }
  __assert_fail("qpdf_update_from_json_file(qpdf, xarg) == QPDF_SUCCESS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x500,"void test44(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test44(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    assert(qpdf_read(qpdf, infile, password) == 0);
    assert(qpdf_update_from_json_file(qpdf, xarg) == QPDF_SUCCESS);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}